

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.h
# Opt level: O2

bool __thiscall
capnproto_test::capnp::test::TestInterleavedGroups::Group1::Reader::hasWaldo(Reader *this)

{
  bool bVar1;
  PointerReader local_28;
  
  if ((this->_reader).pointerCount == 0) {
    local_28.segment = (SegmentReader *)0x0;
    local_28.capTable = (CapTableReader *)0x0;
    local_28.pointer = (WirePointer *)0x0;
    local_28.nestingLimit = 0x7fffffff;
  }
  else {
    local_28.pointer = (this->_reader).pointers;
    local_28.nestingLimit = (this->_reader).nestingLimit;
    local_28.segment = (this->_reader).segment;
    local_28.capTable = (this->_reader).capTable;
  }
  bVar1 = ::capnp::_::PointerReader::isNull(&local_28);
  return !bVar1;
}

Assistant:

inline bool TestInterleavedGroups::Group1::Reader::hasWaldo() const {
  return !_reader.getPointerField(
      ::capnp::bounded<0>() * ::capnp::POINTERS).isNull();
}